

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgba.cpp
# Opt level: O3

void testRgba(string *tempDir)

{
  undefined8 *puVar1;
  pointer pcVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  char *pcVar6;
  bool bVar7;
  undefined1 uVar8;
  char cVar9;
  bool bVar10;
  ushort uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  void *pvVar15;
  long *plVar16;
  void *pvVar17;
  undefined4 *puVar18;
  void *pvVar19;
  int *piVar20;
  int y_1;
  float fVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  undefined8 in_R9;
  int x;
  RgbaChannels channels;
  long lVar25;
  int y;
  long lVar26;
  Array2D<Imf_3_2::Rgba> *p1_00;
  float fVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string fileName;
  Array2D<Imf_3_2::Rgba> p1;
  RgbaOutputFile out;
  Compression in_stack_ffffffffffffff08;
  Rgba local_c8 [2];
  long local_b8 [6];
  char *local_88 [2];
  char local_78 [16];
  double local_68;
  undefined8 local_60;
  undefined8 local_58;
  void *local_50;
  Rgba local_48 [3];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing the RGBA image interface",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  if (((((_imath_half_to_float_table[0x4000] != 2.0) || (NAN(_imath_half_to_float_table[0x4000])))
       || (_imath_half_to_float_table[0x4200] != 3.0)) ||
      ((NAN(_imath_half_to_float_table[0x4200]) || (_imath_half_to_float_table[0x4400] != 4.0)))) ||
     ((NAN(_imath_half_to_float_table[0x4400]) ||
      ((_imath_half_to_float_table[0x3c00] != 1.0 || (NAN(_imath_half_to_float_table[0x3c00])))))))
  {
    __assert_fail("x.r == 2.f && x.g == 3.f && x.b == 4.f && x.a == 1.f",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                  ,0x2f,"void (anonymous namespace)::rgbaMethods()");
  }
  if ((((_imath_half_to_float_table[0x4500] != 5.0) || (NAN(_imath_half_to_float_table[0x4500]))) ||
      (_imath_half_to_float_table[0x4600] != 6.0)) ||
     (((NAN(_imath_half_to_float_table[0x4600]) || (_imath_half_to_float_table[0x4700] != 7.0)) ||
      ((NAN(_imath_half_to_float_table[0x4700]) ||
       ((*_imath_half_to_float_table != 0.0 || (NAN(*_imath_half_to_float_table))))))))) {
    __assert_fail("y.r == 5.f && y.g == 6.f && y.b == 7.f && y.a == 0.f",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                  ,0x32,"void (anonymous namespace)::rgbaMethods()");
  }
  local_60 = 0x77;
  local_58 = 0xed;
  pvVar15 = operator_new__(0x37158);
  lVar26 = 0;
  local_50 = pvVar15;
  do {
    dVar3 = (double)(int)lVar26;
    local_68 = dVar3 * 0.1;
    lVar25 = 0;
    do {
      dVar4 = (double)(int)lVar25;
      dVar5 = sin(dVar4 * 0.1 + local_68);
      fVar27 = (float)(dVar5 * 0.5 + 0.5);
      fVar21 = ABS(fVar27);
      uVar11 = (ushort)((uint)fVar27 >> 0x10) & 0x8000;
      if ((uint)fVar21 < 0x38800000) {
        if ((0x33000000 < (uint)fVar21) &&
           (uVar12 = (uint)fVar21 & 0x7fffff | 0x800000, cVar9 = (char)((uint)fVar21 >> 0x17),
           uVar11 = uVar11 | (ushort)(uVar12 >> (0x7eU - cVar9 & 0x1f)),
           0x80000000 < uVar12 << (cVar9 + 0xa2U & 0x1f))) {
          uVar11 = uVar11 + 1;
        }
      }
      else if ((uint)fVar21 < 0x7f800000) {
        if ((uint)fVar21 < 0x477ff000) {
          uVar11 = (ushort)((int)fVar21 + 0x8000fff + (uint)(((uint)fVar21 >> 0xd & 1) != 0) >> 0xd)
                   | uVar11;
        }
        else {
          uVar11 = uVar11 | 0x7c00;
        }
      }
      else {
        uVar11 = uVar11 | 0x7c00;
        if (fVar21 != INFINITY) {
          uVar12 = (uint)fVar21 >> 0xd & 0x3ff;
          uVar11 = uVar11 | (ushort)uVar12 | (ushort)(uVar12 == 0);
        }
      }
      *(ushort *)((long)pvVar15 + lVar25 * 8) = uVar11;
      dVar5 = sin(dVar4 * 0.1 + dVar3 * 0.2);
      fVar27 = (float)(dVar5 * 0.5 + 0.5);
      fVar21 = ABS(fVar27);
      uVar11 = (ushort)((uint)fVar27 >> 0x10) & 0x8000;
      if ((uint)fVar21 < 0x38800000) {
        if ((0x33000000 < (uint)fVar21) &&
           (uVar12 = (uint)fVar21 & 0x7fffff | 0x800000, cVar9 = (char)((uint)fVar21 >> 0x17),
           uVar11 = uVar11 | (ushort)(uVar12 >> (0x7eU - cVar9 & 0x1f)),
           0x80000000 < uVar12 << (cVar9 + 0xa2U & 0x1f))) {
          uVar11 = uVar11 + 1;
        }
      }
      else if ((uint)fVar21 < 0x7f800000) {
        if ((uint)fVar21 < 0x477ff000) {
          uVar11 = (ushort)((int)fVar21 + 0x8000fff + (uint)(((uint)fVar21 >> 0xd & 1) != 0) >> 0xd)
                   | uVar11;
        }
        else {
          uVar11 = uVar11 | 0x7c00;
        }
      }
      else {
        uVar11 = uVar11 | 0x7c00;
        if (fVar21 != INFINITY) {
          uVar12 = (uint)fVar21 >> 0xd & 0x3ff;
          uVar11 = uVar11 | (ushort)uVar12 | (ushort)(uVar12 == 0);
        }
      }
      *(ushort *)((long)pvVar15 + lVar25 * 8 + 2) = uVar11;
      dVar4 = sin(dVar4 * 0.1 + dVar3 * 0.3);
      fVar27 = (float)(dVar4 * 0.5 + 0.5);
      fVar21 = ABS(fVar27);
      uVar12 = (uint)fVar27 >> 0x10 & 0x8000;
      if ((uint)fVar21 < 0x38800000) {
        if ((0x33000000 < (uint)fVar21) &&
           (uVar22 = (uint)fVar21 & 0x7fffff | 0x800000, cVar9 = (char)((uint)fVar21 >> 0x17),
           uVar12 = uVar12 | uVar22 >> (0x7eU - cVar9 & 0x1f),
           0x80000000 < uVar22 << (cVar9 + 0xa2U & 0x1f))) {
          uVar12 = uVar12 + 1;
        }
      }
      else if ((uint)fVar21 < 0x7f800000) {
        if ((uint)fVar21 < 0x477ff000) {
          uVar12 = (int)fVar21 + 0x8000fff + (uint)(((uint)fVar21 >> 0xd & 1) != 0) >> 0xd | uVar12;
        }
        else {
          uVar12 = uVar12 | 0x7c00;
        }
      }
      else {
        uVar12 = uVar12 | 0x7c00;
        if (fVar21 != INFINITY) {
          uVar22 = (uint)fVar21 >> 0xd & 0x3ff;
          uVar12 = uVar12 | uVar22 | (uint)(uVar22 == 0);
        }
      }
      *(short *)((long)pvVar15 + lVar25 * 8 + 4) = (short)uVar12;
      fVar27 = (_imath_half_to_float_table[*(ushort *)((long)pvVar15 + lVar25 * 8)] +
                _imath_half_to_float_table[uVar12 & 0xffff] +
               _imath_half_to_float_table[*(ushort *)((long)pvVar15 + lVar25 * 8 + 2)]) / 3.0;
      fVar21 = ABS(fVar27);
      uVar11 = (ushort)((uint)fVar27 >> 0x10) & 0x8000;
      if ((uint)fVar21 < 0x38800000) {
        if ((0x33000000 < (uint)fVar21) &&
           (uVar12 = (uint)fVar21 & 0x7fffff | 0x800000, cVar9 = (char)((uint)fVar21 >> 0x17),
           uVar11 = uVar11 | (ushort)(uVar12 >> (0x7eU - cVar9 & 0x1f)),
           0x80000000 < uVar12 << (cVar9 + 0xa2U & 0x1f))) {
          uVar11 = uVar11 + 1;
        }
      }
      else if ((uint)fVar21 < 0x7f800000) {
        if ((uint)fVar21 < 0x477ff000) {
          uVar11 = (ushort)((int)fVar21 + 0x8000fff + (uint)(((uint)fVar21 >> 0xd & 1) != 0) >> 0xd)
                   | uVar11;
        }
        else {
          uVar11 = uVar11 | 0x7c00;
        }
      }
      else {
        uVar11 = uVar11 | 0x7c00;
        if (fVar21 != INFINITY) {
          uVar12 = (uint)fVar21 >> 0xd & 0x3ff;
          uVar11 = uVar11 | (ushort)uVar12 | (ushort)(uVar12 == 0);
        }
      }
      *(ushort *)((long)pvVar15 + lVar25 * 8 + 6) = uVar11;
      lVar25 = lVar25 + 1;
    } while (lVar25 != 0xed);
    lVar26 = lVar26 + 1;
    pvVar15 = (void *)((long)pvVar15 + 0x768);
  } while (lVar26 != 0x77);
  uVar8 = IlmThread_3_2::supportsThreads();
  local_68 = (double)CONCAT71(local_68._1_7_,uVar8);
  cVar9 = IlmThread_3_2::supportsThreads();
  if (cVar9 != '\0') {
    Imf_3_2::setGlobalThreadCount(0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nnumber of threads: ",0x14);
    iVar13 = Imf_3_2::globalThreadCount();
    plVar16 = (long *)std::ostream::operator<<(&std::cout,iVar13);
    std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
    std::ostream::put((char)plVar16);
    std::ostream::flush();
  }
  p1_00 = (Array2D<Imf_3_2::Rgba> *)0x0;
  bVar7 = true;
  do {
    bVar10 = bVar7;
    channels = 0;
    do {
      pcVar2 = (tempDir->_M_dataplus)._M_p;
      local_c8[0] = (Rgba)local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c8,pcVar2,pcVar2 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)local_c8);
      iVar13 = (int)&local_60;
      anon_unknown.dwarf_2b9686::writeReadRGBA
                ((char *)local_c8[0],iVar13,0xf,p1_00,channels,(LineOrder)in_R9,
                 in_stack_ffffffffffffff08);
      if (local_c8[0] != (Rgba)local_b8) {
        operator_delete((void *)local_c8[0],local_b8[0] + 1);
      }
      pcVar2 = (tempDir->_M_dataplus)._M_p;
      local_c8[0] = (Rgba)local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c8,pcVar2,pcVar2 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)local_c8);
      anon_unknown.dwarf_2b9686::writeReadRGBA
                ((char *)local_c8[0],iVar13,7,p1_00,channels,(LineOrder)in_R9,
                 in_stack_ffffffffffffff08);
      if (local_c8[0] != (Rgba)local_b8) {
        operator_delete((void *)local_c8[0],local_b8[0] + 1);
      }
      pcVar2 = (tempDir->_M_dataplus)._M_p;
      local_c8[0] = (Rgba)local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c8,pcVar2,pcVar2 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)local_c8);
      anon_unknown.dwarf_2b9686::writeReadRGBA
                ((char *)local_c8[0],iVar13,8,p1_00,channels,(LineOrder)in_R9,
                 in_stack_ffffffffffffff08);
      if (local_c8[0] != (Rgba)local_b8) {
        operator_delete((void *)local_c8[0],local_b8[0] + 1);
      }
      pcVar2 = (tempDir->_M_dataplus)._M_p;
      local_c8[0] = (Rgba)local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c8,pcVar2,pcVar2 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)local_c8);
      anon_unknown.dwarf_2b9686::writeReadRGBA
                ((char *)local_c8[0],iVar13,5,p1_00,channels,(LineOrder)in_R9,
                 in_stack_ffffffffffffff08);
      if (local_c8[0] != (Rgba)local_b8) {
        operator_delete((void *)local_c8[0],local_b8[0] + 1);
      }
      channels = channels + WRITE_R;
    } while (channels != (WRITE_A|WRITE_G));
    p1_00 = (Array2D<Imf_3_2::Rgba> *)0x1;
    bVar7 = false;
  } while (bVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nfile with missing and broken scan lines",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  local_88[0] = local_78;
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar2,pcVar2 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_88);
  pvVar17 = operator_new__(960000);
  testRgba();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  remove(local_88[0]);
  local_48[0].r._h = 0;
  local_48[0].g._h = 0;
  local_48[0].b._h = 0;
  local_48[0].a._h = 0;
  Imf_3_2::Header::Header
            ((Header *)local_c8,400,300,1.0,(Vec2 *)local_48,1.0,INCREASING_Y,ZIP_COMPRESSION);
  puVar18 = (undefined4 *)Imf_3_2::Header::compression();
  pcVar6 = local_88[0];
  *puVar18 = 2;
  iVar13 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_48,pcVar6,(Header *)local_c8,WRITE_RGBA,iVar13);
  Imf_3_2::RgbaOutputFile::setFrameBuffer(local_48,(ulong)pvVar17,1);
  iVar13 = (int)local_48;
  Imf_3_2::RgbaOutputFile::writePixels(iVar13);
  Imf_3_2::RgbaOutputFile::breakScanLine(iVar13,10,10,'\n');
  Imf_3_2::RgbaOutputFile::breakScanLine(iVar13,0x19,10,'\n');
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_48);
  Imf_3_2::Header::~Header((Header *)local_c8);
  pvVar19 = operator_new__(960000);
  lVar26 = 0;
  pvVar15 = pvVar19;
  do {
    lVar25 = 0;
    do {
      puVar1 = (undefined8 *)((long)pvVar15 + lVar25 * 8);
      *puVar1 = 0xbc00bc00bc00bc00;
      puVar1[1] = 0xbc00bc00bc00bc00;
      lVar25 = lVar25 + 2;
    } while (lVar25 != 400);
    lVar26 = lVar26 + 1;
    pvVar15 = (void *)((long)pvVar15 + 0xc80);
  } while (lVar26 != 300);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"reading one scan line at a time,",0x20);
  std::ostream::flush();
  pcVar6 = local_88[0];
  iVar13 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_c8,pcVar6,iVar13);
  piVar20 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
  if (piVar20[2] - *piVar20 != 399) {
    __assert_fail("dw.max.x - dw.min.x + 1 == width",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                  ,0xee,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
  }
  if (piVar20[3] - piVar20[1] != 299) {
    __assert_fail("dw.max.y - dw.min.y + 1 == height",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                  ,0xef,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
  }
  if (*piVar20 != 0) {
    __assert_fail("dw.min.x == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                  ,0xf0,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
  }
  if (piVar20[1] != 0) {
    __assert_fail("dw.min.y == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                  ,0xf1,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
  }
  Imf_3_2::RgbaInputFile::setFrameBuffer(local_c8,(ulong)pvVar19,1);
  uVar12 = 0;
  do {
    iVar13 = (int)local_c8;
    Imf_3_2::RgbaInputFile::readPixels(iVar13);
    if ((uVar12 == 0x19) || (uVar12 == 10)) {
      __assert_fail("scanLineBroken",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                    ,0x108,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (0x95 < uVar12) {
      __assert_fail("scanLinePresent == (y < height / 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                    ,0x10a,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 300);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::ostream::flush();
  lVar26 = (long)pvVar19 + 6;
  lVar25 = (long)pvVar17 + 6;
  uVar23 = 0;
  do {
    lVar24 = 0;
    do {
      if (((uVar23 < 0x96) && ((char)uVar23 != '\n')) && (((uint)uVar23 & 0xff) != 0x19)) {
        if (((((_imath_half_to_float_table[*(ushort *)(lVar26 + -6 + lVar24 * 8)] !=
                _imath_half_to_float_table[*(ushort *)(lVar25 + -6 + lVar24 * 8)]) ||
              (NAN(_imath_half_to_float_table[*(ushort *)(lVar26 + -6 + lVar24 * 8)]) ||
               NAN(_imath_half_to_float_table[*(ushort *)(lVar25 + -6 + lVar24 * 8)]))) ||
             (_imath_half_to_float_table[*(ushort *)(lVar26 + -4 + lVar24 * 8)] !=
              _imath_half_to_float_table[*(ushort *)(lVar25 + -4 + lVar24 * 8)])) ||
            ((NAN(_imath_half_to_float_table[*(ushort *)(lVar26 + -4 + lVar24 * 8)]) ||
              NAN(_imath_half_to_float_table[*(ushort *)(lVar25 + -4 + lVar24 * 8)]) ||
             (_imath_half_to_float_table[*(ushort *)(lVar26 + -2 + lVar24 * 8)] !=
              _imath_half_to_float_table[*(ushort *)(lVar25 + -2 + lVar24 * 8)])))) ||
           (NAN(_imath_half_to_float_table[*(ushort *)(lVar26 + -2 + lVar24 * 8)]) ||
            NAN(_imath_half_to_float_table[*(ushort *)(lVar25 + -2 + lVar24 * 8)]))) {
LAB_0019a5b2:
          __assert_fail("t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                        ,0x119,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
        if ((_imath_half_to_float_table[*(ushort *)(lVar26 + lVar24 * 8)] !=
             _imath_half_to_float_table[*(ushort *)(lVar25 + lVar24 * 8)]) ||
           (NAN(_imath_half_to_float_table[*(ushort *)(lVar26 + lVar24 * 8)]) ||
            NAN(_imath_half_to_float_table[*(ushort *)(lVar25 + lVar24 * 8)]))) goto LAB_0019a5b2;
      }
      else if (((((_imath_half_to_float_table[*(ushort *)(lVar26 + -6 + lVar24 * 8)] != -1.0) ||
                 (NAN(_imath_half_to_float_table[*(ushort *)(lVar26 + -6 + lVar24 * 8)]))) ||
                ((_imath_half_to_float_table[*(ushort *)(lVar26 + -4 + lVar24 * 8)] != -1.0 ||
                 ((NAN(_imath_half_to_float_table[*(ushort *)(lVar26 + -4 + lVar24 * 8)]) ||
                  (_imath_half_to_float_table[*(ushort *)(lVar26 + -2 + lVar24 * 8)] != -1.0))))))
               || (NAN(_imath_half_to_float_table[*(ushort *)(lVar26 + -2 + lVar24 * 8)]))) ||
              ((_imath_half_to_float_table[*(ushort *)(lVar26 + lVar24 * 8)] != -1.0 ||
               (NAN(_imath_half_to_float_table[*(ushort *)(lVar26 + lVar24 * 8)]))))) {
        __assert_fail("t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x11d,"void (anonymous namespace)::writeReadIncomplete(const std::string &)")
        ;
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != 400);
    uVar23 = uVar23 + 1;
    lVar26 = lVar26 + 0xc80;
    lVar25 = lVar25 + 0xc80;
    if (uVar23 == 300) {
      Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_c8);
      operator_delete__(pvVar19);
      pvVar17 = operator_new__(960000);
      lVar26 = 0;
      pvVar15 = pvVar17;
      do {
        lVar25 = 0;
        do {
          puVar1 = (undefined8 *)((long)pvVar15 + lVar25 * 8);
          *puVar1 = 0xbc00bc00bc00bc00;
          puVar1[1] = 0xbc00bc00bc00bc00;
          lVar25 = lVar25 + 2;
        } while (lVar25 != 400);
        lVar26 = lVar26 + 1;
        pvVar15 = (void *)((long)pvVar15 + 0xc80);
      } while (lVar26 != 300);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"reading multiple scan lines at a time,",0x26);
      std::ostream::flush();
      pcVar6 = local_88[0];
      iVar14 = Imf_3_2::globalThreadCount();
      Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_c8,pcVar6,iVar14);
      piVar20 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
      if (piVar20[2] - *piVar20 != 399) {
        __assert_fail("dw.max.x - dw.min.x + 1 == width",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x12f,"void (anonymous namespace)::writeReadIncomplete(const std::string &)")
        ;
      }
      if (piVar20[3] - piVar20[1] != 299) {
        __assert_fail("dw.max.y - dw.min.y + 1 == height",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x130,"void (anonymous namespace)::writeReadIncomplete(const std::string &)")
        ;
      }
      if (*piVar20 == 0) {
        if (piVar20[1] == 0) {
          Imf_3_2::RgbaInputFile::setFrameBuffer(local_c8,(ulong)pvVar17,1);
          Imf_3_2::RgbaInputFile::readPixels(iVar13,0);
          __assert_fail("scanLinesMissing || scanLinesBroken",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                        ,0x146,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
        __assert_fail("dw.min.y == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x132,"void (anonymous namespace)::writeReadIncomplete(const std::string &)")
        ;
      }
      __assert_fail("dw.min.x == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                    ,0x131,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
  } while( true );
}

Assistant:

void
testRgba (const std::string& tempDir)
{
    try
    {
        cout << "Testing the RGBA image interface" << endl;

        rgbaMethods ();

        const int W = 237;
        const int H = 119;

        Array2D<Rgba> p1 (H, W);
        fillPixels (p1, W, H);

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
            {
                for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
                {
                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_RGBA,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_RGB,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_A,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        RgbaChannels (WRITE_R | WRITE_B),
                        LineOrder (lorder),
                        Compression (comp));
                }
            }

            writeReadIncomplete (tempDir);
        }

        writeReadLayers (tempDir, false);
        writeReadLayers (tempDir, true);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}